

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void icu_63::initShortZoneIdTrie(UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  StringEnumeration *pSVar3;
  TextTrieMap *this;
  undefined4 extraout_var;
  UChar *value;
  UChar *key;
  size_t size;
  TextTrieMap *local_58;
  UChar *shortID;
  UChar *uID;
  UnicodeString *id;
  StringEnumeration *tzenum;
  UErrorCode *status_local;
  UnicodeString *tzid;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONEFORMAT,tzfmt_cleanup);
  size = 0;
  pSVar3 = TimeZone::createTimeZoneIDEnumeration
                     (UCAL_ZONE_TYPE_CANONICAL,(char *)0x0,(int32_t *)0x0,status);
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    this = (TextTrieMap *)UMemory::operator_new((UMemory *)0x38,size);
    local_58 = (TextTrieMap *)0x0;
    if (this != (TextTrieMap *)0x0) {
      TextTrieMap::TextTrieMap(this,'\x01',(UObjectDeleter *)0x0);
      local_58 = this;
    }
    gShortZoneIdTrie = local_58;
    if (local_58 == (TextTrieMap *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      while( true ) {
        iVar2 = (*(pSVar3->super_UObject)._vptr_UObject[7])(pSVar3,status);
        tzid = (UnicodeString *)CONCAT44(extraout_var,iVar2);
        if (tzid == (UnicodeString *)0x0) break;
        value = ZoneMeta::findTimeZoneID(tzid);
        key = ZoneMeta::getShortID(tzid);
        if ((key != (UChar *)0x0) && (value != (UChar *)0x0)) {
          TextTrieMap::put(gShortZoneIdTrie,key,value,status);
        }
      }
    }
  }
  if (pSVar3 != (StringEnumeration *)0x0) {
    (*(pSVar3->super_UObject)._vptr_UObject[1])();
  }
  return;
}

Assistant:

static void U_CALLCONV initShortZoneIdTrie(UErrorCode &status) {
    U_ASSERT(gShortZoneIdTrie == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_TIMEZONEFORMAT, tzfmt_cleanup);
    StringEnumeration *tzenum = TimeZone::createTimeZoneIDEnumeration(UCAL_ZONE_TYPE_CANONICAL, NULL, NULL, status);
    if (U_SUCCESS(status)) {
        gShortZoneIdTrie = new TextTrieMap(TRUE, NULL);    // No deleter, because values are pooled by ZoneMeta
        if (gShortZoneIdTrie == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            const UnicodeString *id;
            while ((id = tzenum->snext(status)) != NULL) {
                const UChar* uID = ZoneMeta::findTimeZoneID(*id);
                const UChar* shortID = ZoneMeta::getShortID(*id);
                if (shortID && uID) {
                    gShortZoneIdTrie->put(shortID, const_cast<UChar *>(uID), status);
                }
            }
        }
    }
    delete tzenum;
}